

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed.c++
# Opt level: O1

size_t __thiscall
capnp::computeUnpackedSizeInWords(capnp *this,ArrayPtr<const_unsigned_char> packedBytes)

{
  byte *pbVar1;
  byte bVar2;
  size_t sVar3;
  capnp *pcVar4;
  Fault f;
  byte *ptr;
  DebugComparison<long,_unsigned_long_&> _kjCondition;
  Fault f_3;
  size_t count;
  byte *end;
  
  end = (byte *)(this + (long)packedBytes.ptr);
  sVar3 = 0;
  if (0 < (long)packedBytes.ptr) {
    _kjCondition.right = &count;
    ptr = (byte *)this;
    do {
      bVar2 = *ptr;
      count = (size_t)(((uint)bVar2 * 0x8040201 >> 3 & 0x11111111) * 0x11111111 >> 0x1c);
      _kjCondition.left = (long)end - (long)ptr;
      _kjCondition.op.content.ptr = " >= ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = (ulong)_kjCondition.left >= count;
      if ((ulong)_kjCondition.left < count) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<long,unsigned_long&>&,char_const(&)[20]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                   ,0x1eb,FAILED,"end - ptr >= count","_kjCondition,\"invalid packed data\"",
                   &_kjCondition,(char (*) [20])"invalid packed data");
        kj::_::Debug::Fault::fatal(&f);
      }
      sVar3 = sVar3 + 1;
      pcVar4 = (capnp *)(ptr + count + 1);
      _kjCondition.left = (long)&ptr;
      if (bVar2 == 0xff) {
        _kjCondition.op.content.ptr = " < ";
        _kjCondition.op.content.size_ = 4;
        _kjCondition.result = pcVar4 < end;
        if (!_kjCondition.result) {
          ptr = (byte *)pcVar4;
          _kjCondition.right = (unsigned_long *)&end;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_char_const*&,unsigned_char_const*&>&,char_const(&)[20]>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                     ,0x1f2,FAILED,"ptr < end","_kjCondition,\"invalid packed data\"",
                     (DebugComparison<const_unsigned_char_*&,_const_unsigned_char_*&> *)
                     &_kjCondition,(char (*) [20])"invalid packed data");
          kj::_::Debug::Fault::fatal(&f);
        }
        pbVar1 = ptr + count + 2;
        f.exception = (Exception *)(ulong)((uint)ptr[count + 1] * 8);
        _kjCondition.left = (long)((capnp *)end + -(long)pbVar1);
        _kjCondition.op.content.ptr = " >= ";
        _kjCondition.op.content.size_ = 5;
        _kjCondition.result = (ulong)_kjCondition.left >= f.exception;
        if ((ulong)_kjCondition.left < f.exception) {
          ptr = pbVar1;
          _kjCondition.right = (unsigned_long *)&f;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<long,unsigned_long&>&,char_const(&)[20]>
                    (&f_3,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                     ,0x1f6,FAILED,"end - ptr >= bytes","_kjCondition,\"invalid packed data\"",
                     &_kjCondition,(char (*) [20])"invalid packed data");
          kj::_::Debug::Fault::fatal(&f_3);
        }
        sVar3 = sVar3 + ptr[count + 1];
        pcVar4 = (capnp *)(pbVar1 + (long)f.exception);
      }
      else if (bVar2 == 0) {
        _kjCondition.op.content.ptr = " < ";
        _kjCondition.op.content.size_ = 4;
        _kjCondition.result = pcVar4 < end;
        if (!_kjCondition.result) {
          ptr = (byte *)pcVar4;
          _kjCondition.right = (unsigned_long *)&end;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_char_const*&,unsigned_char_const*&>&,char_const(&)[20]>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                     ,0x1ef,FAILED,"ptr < end","_kjCondition,\"invalid packed data\"",
                     (DebugComparison<const_unsigned_char_*&,_const_unsigned_char_*&> *)
                     &_kjCondition,(char (*) [20])"invalid packed data");
          kj::_::Debug::Fault::fatal(&f);
        }
        sVar3 = sVar3 + ptr[count + 1];
        pcVar4 = (capnp *)(ptr + count + 2);
      }
      ptr = (byte *)pcVar4;
    } while (ptr < end);
  }
  return sVar3;
}

Assistant:

size_t computeUnpackedSizeInWords(kj::ArrayPtr<const byte> packedBytes) {
  const byte* ptr = packedBytes.begin();
  const byte* end = packedBytes.end();

  size_t total = 0;
  while (ptr < end) {
    uint tag = *ptr;
    size_t count = kj::popCount(tag);
    total += 1;
    KJ_REQUIRE(end - ptr >= count, "invalid packed data");
    ptr += count + 1;

    if (tag == 0) {
      KJ_REQUIRE(ptr < end, "invalid packed data");
      total += *ptr++;
    } else if (tag == 0xff) {
      KJ_REQUIRE(ptr < end, "invalid packed data");
      size_t words = *ptr++;
      total += words;
      size_t bytes = words * sizeof(word);
      KJ_REQUIRE(end - ptr >= bytes, "invalid packed data");
      ptr += bytes;
    }
  }

  return total;
}